

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

yyjson_mut_val *
duckdb_yyjson::yyjson_patch
          (yyjson_mut_doc *doc,yyjson_val *orig,yyjson_val *patch,yyjson_patch_err *err)

{
  char **ppcVar1;
  size_t sVar2;
  char cVar3;
  yyjson_ptr_code yVar4;
  ulong uVar5;
  bool bVar6;
  patch_op pVar7;
  int iVar8;
  yyjson_val *pyVar9;
  yyjson_val *pyVar10;
  char *pcVar11;
  yyjson_mut_val *pyVar12;
  yyjson_mut_val *lhs;
  char *pcVar13;
  ulong uVar14;
  size_t ptr_len;
  yyjson_ptr_err *err_00;
  ulong uVar15;
  size_t sVar16;
  yyjson_val *pyVar17;
  char *pcVar18;
  yyjson_val *pyVar19;
  yyjson_ptr_code local_b4;
  char *local_a8;
  yyjson_mut_val *local_98;
  yyjson_patch_err err_tmp;
  
  if (err == (yyjson_patch_err *)0x0) {
    err = &err_tmp;
    err_00 = &err_tmp.ptr;
  }
  else {
    err_00 = &err->ptr;
  }
  (err->ptr).msg = (char *)0x0;
  (err->ptr).pos = 0;
  err->msg = (char *)0x0;
  *(undefined8 *)&err->ptr = 0;
  *(undefined8 *)err = 0;
  err->idx = 0;
  if (((doc == (yyjson_mut_doc *)0x0) || (orig == (yyjson_val *)0x0)) ||
     (patch == (yyjson_val *)0x0)) {
    if ((err->ptr).code != 6) {
      err->code = 1;
      pcVar13 = "input parameter is NULL";
LAB_00200d3d:
      err->msg = pcVar13;
LAB_00200d41:
      err->idx = 0;
      return (yyjson_mut_val *)0x0;
    }
    err->code = 2;
    pcVar13 = "input parameter is NULL";
  }
  else {
    if ((patch->tag & 7) == 6) {
      local_98 = yyjson_val_mut_copy(doc,orig);
      if (local_98 != (yyjson_mut_val *)0x0) {
        uVar5 = patch->tag;
        if (((uint)uVar5 & 7) != 6) {
          return local_98;
        }
        if (uVar5 < 0x100) {
          return local_98;
        }
        ppcVar1 = &err_00->msg;
        pcVar13 = (char *)0x10;
        sVar16 = 0;
        pyVar17 = patch + 1;
        while( true ) {
          uVar15 = pyVar17->tag;
          pcVar18 = pcVar13;
          if ((~(uint)uVar15 & 6) == 0) {
            pcVar18 = (pyVar17->uni).str;
          }
          if ((~(uint)uVar15 & 7) != 0) break;
          if (uVar15 < 0x100) {
LAB_00200bc3:
            if ((err->ptr).code != 6) {
              err->code = 4;
              pcVar13 = "missing key `op`";
              goto LAB_00200bee;
            }
            err->code = 2;
            pcVar13 = "missing key `op`";
            goto LAB_00200bd9;
          }
          sVar2 = sVar16 + 1;
          uVar15 = uVar15 >> 8;
          pyVar19 = pyVar17 + 1;
          pyVar9 = pyVar19;
          uVar14 = uVar15;
          while (((pyVar9->tag & 0xffffffffffffff00) != 0x200 ||
                 (*(short *)(pyVar9->uni).str != 0x706f))) {
            pcVar11 = pcVar13;
            if ((~(uint)pyVar9[1].tag & 6) == 0) {
              pcVar11 = pyVar9[1].uni.str;
            }
            pyVar9 = (yyjson_val *)(pcVar11 + (long)(pyVar9 + 1));
            uVar14 = uVar14 - 1;
            if (uVar14 == 0) goto LAB_00200bc3;
          }
          local_a8 = "input parameter is NULL";
          if (((uint)(duckdb_yyjson *)pyVar9[1].tag & 7) != 5) {
            if ((err->ptr).code != 6) {
              err->code = 5;
              err->msg = "invalid member `op`";
              err->idx = sVar16;
              return (yyjson_mut_val *)0x0;
            }
            err->code = 2;
            pcVar13 = "invalid member `op`";
            goto LAB_00200bd9;
          }
          pVar7 = patch_op_get((duckdb_yyjson *)pyVar9[1].tag,(yyjson_val *)pyVar9[1].uni.str);
          uVar14 = uVar15;
          pyVar9 = pyVar19;
          while (((pyVar9->tag & 0xffffffffffffff00) != 0x400 ||
                 (*(int *)(pyVar9->uni).str != 0x68746170))) {
            pcVar11 = pcVar13;
            if ((~(uint)pyVar9[1].tag & 6) == 0) {
              pcVar11 = pyVar9[1].uni.str;
            }
            pyVar9 = (yyjson_val *)(pcVar11 + (long)(pyVar9 + 1));
            uVar14 = uVar14 - 1;
            if (uVar14 == 0) {
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar13 = "missing key `path`";
                goto LAB_00200c10;
              }
              err->code = 4;
              pcVar13 = "missing key `path`";
              goto LAB_00200c33;
            }
          }
          uVar14 = pyVar9[1].tag;
          if (((uint)uVar14 & 7) != 5) {
            if ((err->ptr).code != 6) {
              err->code = 5;
              pcVar13 = "invalid member `path`";
              goto LAB_00201032;
            }
            err->code = 2;
            pcVar13 = "invalid member `path`";
LAB_00200c10:
            err->msg = pcVar13;
            goto LAB_00200c14;
          }
          if (pVar7 < PATCH_OP_NONE) {
            if ((0x25U >> (pVar7 & 0x1f) & 1) == 0) {
              pyVar10 = (yyjson_val *)0x0;
              lhs = (yyjson_mut_val *)0x0;
              ptr_len = 0;
              if ((0x18U >> (pVar7 & 0x1f) & 1) != 0) {
                while (((pyVar19->tag & 0xffffffffffffff00) != 0x400 ||
                       (*(int *)(pyVar19->uni).str != 0x6d6f7266))) {
                  pcVar11 = pcVar13;
                  if ((~(uint)pyVar19[1].tag & 6) == 0) {
                    pcVar11 = pyVar19[1].uni.str;
                  }
                  pyVar19 = (yyjson_val *)(pcVar11 + (long)(pyVar19 + 1));
                  uVar15 = uVar15 - 1;
                  if (uVar15 == 0) {
                    if ((err->ptr).code == 6) {
                      err->code = 2;
                      pcVar13 = "missing key `from`";
                      goto LAB_00200c10;
                    }
                    err->code = 4;
                    pcVar13 = "missing key `from`";
                    goto LAB_00200c33;
                  }
                }
                if (((uint)pyVar19[1].tag & 7) != 5) {
                  if ((err->ptr).code != 6) {
                    err->code = 5;
                    pcVar13 = "invalid member `from`";
                    goto LAB_00201032;
                  }
                  err->code = 2;
                  pcVar13 = "invalid member `from`";
                  goto LAB_00200c10;
                }
                pyVar10 = pyVar19 + 1;
                ptr_len = pyVar19[1].tag >> 8;
                lhs = (yyjson_mut_val *)0x0;
              }
              goto LAB_0020081e;
            }
            while (((pyVar19->tag & 0xffffffffffffff00) != 0x500 ||
                   (iVar8 = bcmp((pyVar19->uni).ptr,"value",5), iVar8 != 0))) {
              pcVar11 = pcVar13;
              if ((~(uint)pyVar19[1].tag & 6) == 0) {
                pcVar11 = pyVar19[1].uni.str;
              }
              pyVar19 = (yyjson_val *)(pcVar11 + (long)(pyVar19 + 1));
              uVar15 = uVar15 - 1;
              if (uVar15 == 0) {
                if ((err->ptr).code == 6) {
                  err->code = 2;
                  pcVar13 = "missing key `value`";
                  goto LAB_00200c10;
                }
                err->code = 4;
                pcVar13 = "missing key `value`";
                goto LAB_00200c33;
              }
            }
            lhs = yyjson_val_mut_copy(doc,pyVar19 + 1);
            if (lhs != (yyjson_mut_val *)0x0) {
              pyVar10 = (yyjson_val *)0x0;
              ptr_len = 0;
              goto LAB_0020081e;
            }
LAB_00201058:
            yVar4 = (err->ptr).code;
            err->code = 2;
            err->msg = "failed to copy value";
            if (yVar4 != 6) {
              err->idx = sVar16;
              return (yyjson_mut_val *)0x0;
            }
            goto LAB_00200c14;
          }
          pyVar10 = (yyjson_val *)0x0;
          lhs = (yyjson_mut_val *)0x0;
          ptr_len = 0;
LAB_0020081e:
          local_b4 = 1;
          if (PATCH_OP_TEST < pVar7) {
            if ((err->ptr).code != 6) {
              err->code = 5;
              pcVar13 = "unsupported `op`";
LAB_00200c33:
              err->msg = pcVar13;
              err->idx = sVar16;
              return (yyjson_mut_val *)0x0;
            }
            err->code = 2;
            pcVar13 = "unsupported `op`";
            goto LAB_00200c10;
          }
          uVar15 = uVar14 >> 8;
          switch(pVar7) {
          case PATCH_OP_ADD:
            if (0xff < uVar14) {
              pcVar11 = pyVar9[1].uni.str;
              (err->ptr).code = 0;
              *ppcVar1 = (char *)0x0;
              err_00->pos = 0;
              if (((lhs == (yyjson_mut_val *)0x0) || (local_98 == (yyjson_mut_val *)0x0)) ||
                 (pcVar11 == (char *)0x0)) {
LAB_00200e16:
                (err->ptr).code = local_b4;
                err_00->msg = local_a8;
                err_00->pos = 0;
              }
              else {
                cVar3 = *pcVar11;
joined_r0x00200a3a:
                if (cVar3 != '/') {
                  local_b4 = 2;
                  local_a8 = "no prefix \'/\'";
                  goto LAB_00200e16;
                }
                bVar6 = unsafe_yyjson_mut_ptr_putx
                                  (local_98,pcVar11,uVar15,lhs,doc,false,true,(yyjson_ptr_ctx *)0x0,
                                   err_00);
                lhs = local_98;
                if (bVar6) goto LAB_00200b5d;
                if ((err->ptr).code == 6) {
                  err->code = 2;
                  pcVar13 = "failed to add `path`";
                  goto LAB_00200c10;
                }
              }
              err->code = 7;
              pcVar13 = "failed to add `path`";
              goto LAB_00201032;
            }
LAB_00200b5d:
            local_98 = lhs;
            sVar16 = sVar2;
            pyVar17 = (yyjson_val *)(pcVar18 + (long)pyVar17);
            if (sVar2 == uVar5 >> 8) {
              return local_98;
            }
            break;
          case PATCH_OP_REMOVE:
            pcVar11 = pyVar9[1].uni.str;
            (err->ptr).code = 0;
            *ppcVar1 = (char *)0x0;
            err_00->pos = 0;
            if ((local_98 == (yyjson_mut_val *)0x0) || (pcVar11 == (char *)0x0)) {
LAB_00200f72:
              (err->ptr).code = local_b4;
              err_00->msg = local_a8;
              err_00->pos = 0;
            }
            else {
              if (uVar14 < 0x100) {
                local_b4 = 5;
                local_a8 = "cannot set root";
                goto LAB_00200f72;
              }
              if (*pcVar11 != '/') {
                local_b4 = 2;
                local_a8 = "no prefix \'/\'";
                goto LAB_00200f72;
              }
              pyVar12 = unsafe_yyjson_mut_ptr_removex
                                  (local_98,pcVar11,uVar15,(yyjson_ptr_ctx *)0x0,err_00);
              lhs = local_98;
              if (pyVar12 != (yyjson_mut_val *)0x0) goto LAB_00200b5d;
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar13 = "failed to remove `path`";
                goto LAB_00200c10;
              }
            }
            err->code = 7;
            pcVar13 = "failed to remove `path`";
LAB_00201032:
            err->msg = pcVar13;
            err->idx = sVar16;
            return (yyjson_mut_val *)0x0;
          case PATCH_OP_REPLACE:
            if (uVar14 < 0x100) goto LAB_00200b5d;
            pcVar11 = pyVar9[1].uni.str;
            (err->ptr).code = 0;
            *ppcVar1 = (char *)0x0;
            err_00->pos = 0;
            if (((lhs == (yyjson_mut_val *)0x0) || (local_98 == (yyjson_mut_val *)0x0)) ||
               (pcVar11 == (char *)0x0)) {
LAB_00200f29:
              (err->ptr).code = local_b4;
              err_00->msg = local_a8;
              err_00->pos = 0;
            }
            else {
              if (*pcVar11 != '/') {
                local_b4 = 2;
                local_a8 = "no prefix \'/\'";
                goto LAB_00200f29;
              }
              pyVar12 = unsafe_yyjson_mut_ptr_replacex
                                  (local_98,pcVar11,uVar15,lhs,(yyjson_ptr_ctx *)0x0,err_00);
              lhs = local_98;
              if (pyVar12 != (yyjson_mut_val *)0x0) goto LAB_00200b5d;
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar13 = "failed to replace `path`";
                goto LAB_00200c10;
              }
            }
            err->code = 7;
            pcVar13 = "failed to replace `path`";
            goto LAB_00201032;
          case PATCH_OP_MOVE:
            lhs = local_98;
            if (ptr_len == 0 && uVar15 == 0) goto LAB_00200b5d;
            pcVar11 = (pyVar10->uni).str;
            (err->ptr).code = 0;
            *ppcVar1 = (char *)0x0;
            err_00->pos = 0;
            if ((local_98 == (yyjson_mut_val *)0x0) || (pcVar11 == (char *)0x0)) {
LAB_00201001:
              (err->ptr).code = local_b4;
              err_00->msg = local_a8;
              err_00->pos = 0;
            }
            else {
              if (ptr_len == 0) {
                local_b4 = 5;
                local_a8 = "cannot set root";
                goto LAB_00201001;
              }
              if (*pcVar11 != '/') {
                local_b4 = 2;
                local_a8 = "no prefix \'/\'";
                goto LAB_00201001;
              }
              lhs = unsafe_yyjson_mut_ptr_removex
                              (local_98,pcVar11,ptr_len,(yyjson_ptr_ctx *)0x0,err_00);
              if (lhs != (yyjson_mut_val *)0x0) {
                if (uVar14 < 0x100) goto LAB_00200b5d;
                goto LAB_00200a10;
              }
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar13 = "failed to remove `from`";
                goto LAB_00200c10;
              }
            }
            err->code = 7;
            pcVar13 = "failed to remove `from`";
            goto LAB_00201032;
          case PATCH_OP_COPY:
            pcVar11 = (pyVar10->uni).str;
            (err->ptr).code = 0;
            *ppcVar1 = (char *)0x0;
            err_00->pos = 0;
            if ((local_98 == (yyjson_mut_val *)0x0) || (pcVar11 == (char *)0x0)) {
LAB_00200ecd:
              (err->ptr).code = local_b4;
              err_00->msg = local_a8;
              err_00->pos = 0;
            }
            else {
              lhs = local_98;
              if (ptr_len == 0) {
LAB_00200900:
                if (0xff < uVar14) {
                  lhs = unsafe_yyjson_mut_val_mut_copy(doc,lhs);
                  if (lhs == (yyjson_mut_val *)0x0) goto LAB_00201058;
LAB_00200a10:
                  pcVar11 = pyVar9[1].uni.str;
                  (err->ptr).code = 0;
                  *ppcVar1 = (char *)0x0;
                  err_00->pos = 0;
                  if (pcVar11 != (char *)0x0) {
                    cVar3 = *pcVar11;
                    goto joined_r0x00200a3a;
                  }
                  goto LAB_00200e16;
                }
                goto LAB_00200b5d;
              }
              if (*pcVar11 != '/') {
                local_b4 = 2;
                local_a8 = "no prefix \'/\'";
                goto LAB_00200ecd;
              }
              lhs = unsafe_yyjson_mut_ptr_getx
                              (local_98,pcVar11,ptr_len,(yyjson_ptr_ctx *)0x0,err_00);
              if (lhs != (yyjson_mut_val *)0x0) goto LAB_00200900;
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar13 = "failed to get `from`";
                goto LAB_00200c10;
              }
            }
            err->code = 7;
            pcVar13 = "failed to get `from`";
            goto LAB_00201032;
          case PATCH_OP_TEST:
            pcVar11 = pyVar9[1].uni.str;
            (err->ptr).code = 0;
            *ppcVar1 = (char *)0x0;
            err_00->pos = 0;
            if ((local_98 == (yyjson_mut_val *)0x0) || (pcVar11 == (char *)0x0)) {
LAB_00200fbb:
              (err->ptr).code = local_b4;
              err_00->msg = local_a8;
              err_00->pos = 0;
            }
            else {
              pyVar12 = local_98;
              if (uVar14 < 0x100) {
LAB_00200b41:
                if ((lhs == (yyjson_mut_val *)0x0) ||
                   (bVar6 = unsafe_yyjson_mut_equals(lhs,pyVar12), lhs = local_98, !bVar6)) {
                  if ((err->ptr).code != 6) {
                    err->code = 6;
                    pcVar13 = "failed to test equal";
                    goto LAB_00201032;
                  }
                  err->code = 2;
                  pcVar13 = "failed to test equal";
                  goto LAB_00200c10;
                }
                goto LAB_00200b5d;
              }
              if (*pcVar11 != '/') {
                local_b4 = 2;
                local_a8 = "no prefix \'/\'";
                goto LAB_00200fbb;
              }
              pyVar12 = unsafe_yyjson_mut_ptr_getx
                                  (local_98,pcVar11,uVar15,(yyjson_ptr_ctx *)0x0,err_00);
              if (pyVar12 != (yyjson_mut_val *)0x0) goto LAB_00200b41;
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar13 = "failed to get `path`";
                goto LAB_00200c10;
              }
            }
            err->code = 7;
            pcVar13 = "failed to get `path`";
            goto LAB_00201032;
          }
        }
        if ((err->ptr).code != 6) {
          err->code = 3;
          pcVar13 = "JSON patch operation is not object";
LAB_00200bee:
          err->msg = pcVar13;
          err->idx = sVar16;
          return (yyjson_mut_val *)0x0;
        }
        err->code = 2;
        pcVar13 = "JSON patch operation is not object";
LAB_00200bd9:
        err->msg = pcVar13;
LAB_00200c14:
        *(undefined8 *)err_00 = 0;
        err_00->msg = (char *)0x0;
        err_00->pos = 0;
        return (yyjson_mut_val *)0x0;
      }
      yVar4 = (err->ptr).code;
      err->code = 2;
      err->msg = "failed to copy value";
      if (yVar4 != 6) goto LAB_00200d41;
      goto LAB_00200cf5;
    }
    if ((err->ptr).code != 6) {
      err->code = 1;
      pcVar13 = "input patch is not array";
      goto LAB_00200d3d;
    }
    err->code = 2;
    pcVar13 = "input patch is not array";
  }
  err->msg = pcVar13;
LAB_00200cf5:
  *(undefined8 *)err_00 = 0;
  err_00->msg = (char *)0x0;
  err_00->pos = 0;
  return (yyjson_mut_val *)0x0;
}

Assistant:

yyjson_mut_val *yyjson_patch(yyjson_mut_doc *doc,
                             yyjson_val *orig,
                             yyjson_val *patch,
                             yyjson_patch_err *err) {

    yyjson_mut_val *root;
    yyjson_val *obj;
    yyjson_arr_iter iter;
    yyjson_patch_err err_tmp;
    if (!err) err = &err_tmp;
    memset(err, 0, sizeof(*err));
    memset(&iter, 0, sizeof(iter));

    if (unlikely(!doc || !orig || !patch)) {
        return_err(INVALID_PARAMETER, "input parameter is NULL");
    }
    if (unlikely(!yyjson_is_arr(patch))) {
        return_err(INVALID_PARAMETER, "input patch is not array");
    }
    root = yyjson_val_mut_copy(doc, orig);
    if (unlikely(!root)) return_err_copy();

    /* iterate through the patch array */
    yyjson_arr_iter_init(patch, &iter);
    while ((obj = yyjson_arr_iter_next(&iter))) {
        patch_op op_enum;
        yyjson_val *op, *path, *from = NULL, *value;
        yyjson_mut_val *val = NULL, *test;
        usize path_len, from_len = 0;
        if (unlikely(!unsafe_yyjson_is_obj(obj))) {
            return_err(INVALID_OPERATION, "JSON patch operation is not object");
        }

        /* get required member: op */
        op = yyjson_obj_get(obj, "op");
        if (unlikely(!op)) return_err_key("`op`");
        if (unlikely(!yyjson_is_str(op))) return_err_val("`op`");
        op_enum = patch_op_get(op);

        /* get required member: path */
        path = yyjson_obj_get(obj, "path");
        if (unlikely(!path)) return_err_key("`path`");
        if (unlikely(!yyjson_is_str(path))) return_err_val("`path`");
        path_len = unsafe_yyjson_get_len(path);

        /* get required member: value, from */
        switch ((int)op_enum) {
            case PATCH_OP_ADD: case PATCH_OP_REPLACE: case PATCH_OP_TEST:
                value = yyjson_obj_get(obj, "value");
                if (unlikely(!value)) return_err_key("`value`");
                val = yyjson_val_mut_copy(doc, value);
                if (unlikely(!val)) return_err_copy();
                break;
            case PATCH_OP_MOVE: case PATCH_OP_COPY:
                from = yyjson_obj_get(obj, "from");
                if (unlikely(!from)) return_err_key("`from`");
                if (unlikely(!yyjson_is_str(from))) return_err_val("`from`");
                from_len = unsafe_yyjson_get_len(from);
                break;
            default:
                break;
        }

        /* perform an operation */
        switch ((int)op_enum) {
            case PATCH_OP_ADD: /* add(path, val) */
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_REMOVE: /* remove(path) */
                if (unlikely(!ptr_remove(path))) {
                    return_err(POINTER, "failed to remove `path`");
                }
                break;
            case PATCH_OP_REPLACE: /* replace(path, val) */
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_replace(path, val))) {
                    return_err(POINTER, "failed to replace `path`");
                }
                break;
            case PATCH_OP_MOVE: /* val = remove(from), add(path, val) */
                if (unlikely(from_len == 0 && path_len == 0)) break;
                val = ptr_remove(from);
                if (unlikely(!val)) {
                    return_err(POINTER, "failed to remove `from`");
                }
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_COPY: /* val = get(from).copy, add(path, val) */
                val = ptr_get(from);
                if (unlikely(!val)) {
                    return_err(POINTER, "failed to get `from`");
                }
                if (unlikely(path_len == 0)) { root = val; break; }
                val = yyjson_mut_val_mut_copy(doc, val);
                if (unlikely(!val)) return_err_copy();
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_TEST: /* test = get(path), test.eq(val) */
                test = ptr_get(path);
                if (unlikely(!test)) {
                    return_err(POINTER, "failed to get `path`");
                }
                if (unlikely(!yyjson_mut_equals(val, test))) {
                    return_err(EQUAL, "failed to test equal");
                }
                break;
            default:
                return_err(INVALID_MEMBER, "unsupported `op`");
        }
    }
    return root;
}